

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

bool __thiscall ON_Environment::operator==(ON_Environment *this,ON_Environment *env)

{
  uint uVar1;
  uint uVar2;
  ON__UINT32 OVar3;
  ON__UINT32 OVar4;
  
  uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_impl->m_back_col);
  uVar2 = ON_Color::operator_cast_to_unsigned_int(&env->m_impl->m_back_col);
  if (uVar2 <= uVar1) {
    uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_impl->m_back_col);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&env->m_impl->m_back_col);
    if ((uVar1 <= uVar2) && (this->m_impl->m_back_proj == env->m_impl->m_back_proj)) {
      OVar3 = ON_Texture_CRC(&this->m_impl->m_back_image);
      OVar4 = ON_Texture_CRC(&env->m_impl->m_back_image);
      return OVar3 == OVar4;
    }
  }
  return false;
}

Assistant:

bool ON_Environment::operator == (const ON_Environment& env) const
{
  if (m_impl->m_back_col < env.m_impl->m_back_col)
    return false;

  if (m_impl->m_back_col > env.m_impl->m_back_col)
    return false;

  if (m_impl->m_back_proj != env.m_impl->m_back_proj)
    return false;

  if (ON_Texture_CRC(m_impl->m_back_image) != ON_Texture_CRC(env.m_impl->m_back_image))
    return false;

  return true;
}